

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void load_weight_w4(int height,__m128i *weight_h,__m128i *weight_w)

{
  longlong lVar1;
  longlong lVar2;
  undefined1 auVar3 [16];
  undefined1 local_138;
  undefined1 uStack_137;
  undefined1 uStack_136;
  undefined1 uStack_135;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short sStack_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  __m128i weight_1;
  __m128i weight;
  __m128i t;
  __m128i d;
  __m128i zero;
  __m128i *weight_w_local;
  __m128i *weight_h_local;
  int height_local;
  
  auVar3 = ZEXT416(0x405595ff);
  local_138 = auVar3[0];
  uStack_137 = auVar3[1];
  uStack_136 = auVar3[2];
  uStack_135 = auVar3[3];
  *(undefined1 *)*weight_h = local_138;
  *(undefined1 *)((long)*weight_h + 1) = 0;
  *(undefined1 *)((long)*weight_h + 2) = uStack_137;
  *(undefined1 *)((long)*weight_h + 3) = 0;
  *(undefined1 *)((long)*weight_h + 4) = uStack_136;
  *(undefined1 *)((long)*weight_h + 5) = 0;
  *(undefined1 *)((long)*weight_h + 6) = uStack_135;
  *(undefined1 *)((long)*weight_h + 7) = 0;
  *(undefined1 *)(*weight_h + 1) = 0;
  *(undefined1 *)((long)*weight_h + 9) = 0;
  *(undefined1 *)((long)*weight_h + 10) = 0;
  *(undefined1 *)((long)*weight_h + 0xb) = 0;
  *(undefined1 *)((long)*weight_h + 0xc) = 0;
  *(undefined1 *)((long)*weight_h + 0xd) = 0;
  *(undefined1 *)((long)*weight_h + 0xe) = 0;
  *(undefined1 *)((long)*weight_h + 0xf) = 0;
  lVar1 = (*weight_h)[0];
  lVar2 = (*weight_h)[1];
  sStack_78 = (short)lVar1;
  sStack_76 = (short)((ulong)lVar1 >> 0x10);
  sStack_74 = (short)((ulong)lVar1 >> 0x20);
  sStack_72 = (short)((ulong)lVar1 >> 0x30);
  weight_1[0]._0_2_ = (short)lVar2;
  weight_1[0]._2_2_ = (short)((ulong)lVar2 >> 0x10);
  weight_1[0]._4_2_ = (short)((ulong)lVar2 >> 0x20);
  weight_1[0]._6_2_ = (short)((ulong)lVar2 >> 0x30);
  *(short *)weight_h[1] = 0x100 - sStack_78;
  *(short *)((long)weight_h[1] + 2) = 0x100 - sStack_76;
  *(short *)((long)weight_h[1] + 4) = 0x100 - sStack_74;
  *(short *)((long)weight_h[1] + 6) = 0x100 - sStack_72;
  *(short *)(weight_h[1] + 1) = 0x100 - (short)weight_1[0];
  *(short *)((long)weight_h[1] + 10) = 0x100 - weight_1[0]._2_2_;
  *(short *)((long)weight_h[1] + 0xc) = 0x100 - weight_1[0]._4_2_;
  *(short *)((long)weight_h[1] + 0xe) = 0x100 - weight_1[0]._6_2_;
  lVar1 = (*weight_h)[0];
  lVar2 = weight_h[1][0];
  weight_w_local._0_2_ = (undefined2)lVar1;
  weight_w_local._2_2_ = (undefined2)((ulong)lVar1 >> 0x10);
  weight_w_local._4_2_ = (undefined2)((ulong)lVar1 >> 0x20);
  weight_w_local._6_2_ = (undefined2)((ulong)lVar1 >> 0x30);
  zero[1]._0_2_ = (undefined2)lVar2;
  zero[1]._2_2_ = (undefined2)((ulong)lVar2 >> 0x10);
  zero[1]._4_2_ = (undefined2)((ulong)lVar2 >> 0x20);
  zero[1]._6_2_ = (undefined2)((ulong)lVar2 >> 0x30);
  *(undefined2 *)*weight_w = weight_w_local._0_2_;
  *(undefined2 *)((long)*weight_w + 2) = (undefined2)zero[1];
  *(undefined2 *)((long)*weight_w + 4) = weight_w_local._2_2_;
  *(undefined2 *)((long)*weight_w + 6) = zero[1]._2_2_;
  *(undefined2 *)(*weight_w + 1) = weight_w_local._4_2_;
  *(undefined2 *)((long)*weight_w + 10) = zero[1]._4_2_;
  *(undefined2 *)((long)*weight_w + 0xc) = weight_w_local._6_2_;
  *(undefined2 *)((long)*weight_w + 0xe) = zero[1]._6_2_;
  if (height == 8) {
    *(undefined1 *)*weight_h = 0xff;
    *(undefined1 *)((long)*weight_h + 1) = 0;
    *(undefined1 *)((long)*weight_h + 2) = 0xc5;
    *(undefined1 *)((long)*weight_h + 3) = 0;
    *(undefined1 *)((long)*weight_h + 4) = 0x92;
    *(undefined1 *)((long)*weight_h + 5) = 0;
    *(undefined1 *)((long)*weight_h + 6) = 0x69;
    *(undefined1 *)((long)*weight_h + 7) = 0;
    *(undefined1 *)(*weight_h + 1) = 0x49;
    *(undefined1 *)((long)*weight_h + 9) = 0;
    *(undefined1 *)((long)*weight_h + 10) = 0x32;
    *(undefined1 *)((long)*weight_h + 0xb) = 0;
    *(undefined1 *)((long)*weight_h + 0xc) = 0x25;
    *(undefined1 *)((long)*weight_h + 0xd) = 0;
    *(undefined1 *)((long)*weight_h + 0xe) = 0x20;
    *(undefined1 *)((long)*weight_h + 0xf) = 0;
    lVar1 = (*weight_h)[0];
    lVar2 = (*weight_h)[1];
    local_98 = (short)lVar1;
    sStack_96 = (short)((ulong)lVar1 >> 0x10);
    sStack_94 = (short)((ulong)lVar1 >> 0x20);
    sStack_92 = (short)((ulong)lVar1 >> 0x30);
    sStack_90 = (short)lVar2;
    sStack_8e = (short)((ulong)lVar2 >> 0x10);
    sStack_8c = (short)((ulong)lVar2 >> 0x20);
    sStack_8a = (short)((ulong)lVar2 >> 0x30);
    *(short *)weight_h[1] = 0x100 - local_98;
    *(short *)((long)weight_h[1] + 2) = 0x100 - sStack_96;
    *(short *)((long)weight_h[1] + 4) = 0x100 - sStack_94;
    *(short *)((long)weight_h[1] + 6) = 0x100 - sStack_92;
    *(short *)(weight_h[1] + 1) = 0x100 - sStack_90;
    *(short *)((long)weight_h[1] + 10) = 0x100 - sStack_8e;
    *(short *)((long)weight_h[1] + 0xc) = 0x100 - sStack_8c;
    *(short *)((long)weight_h[1] + 0xe) = 0x100 - sStack_8a;
  }
  else if (height == 0x10) {
    *(undefined1 *)*weight_h = 0xff;
    *(undefined1 *)((long)*weight_h + 1) = 0;
    *(undefined1 *)((long)*weight_h + 2) = 0xe1;
    *(undefined1 *)((long)*weight_h + 3) = 0;
    *(undefined1 *)((long)*weight_h + 4) = 0xc4;
    *(undefined1 *)((long)*weight_h + 5) = 0;
    *(undefined1 *)((long)*weight_h + 6) = 0xaa;
    *(undefined1 *)((long)*weight_h + 7) = 0;
    *(undefined1 *)(*weight_h + 1) = 0x91;
    *(undefined1 *)((long)*weight_h + 9) = 0;
    *(undefined1 *)((long)*weight_h + 10) = 0x7b;
    *(undefined1 *)((long)*weight_h + 0xb) = 0;
    *(undefined1 *)((long)*weight_h + 0xc) = 0x66;
    *(undefined1 *)((long)*weight_h + 0xd) = 0;
    *(undefined1 *)((long)*weight_h + 0xe) = 0x54;
    *(undefined1 *)((long)*weight_h + 0xf) = 0;
    lVar1 = (*weight_h)[0];
    lVar2 = (*weight_h)[1];
    local_b8 = (short)lVar1;
    sStack_b6 = (short)((ulong)lVar1 >> 0x10);
    sStack_b4 = (short)((ulong)lVar1 >> 0x20);
    sStack_b2 = (short)((ulong)lVar1 >> 0x30);
    sStack_b0 = (short)lVar2;
    sStack_ae = (short)((ulong)lVar2 >> 0x10);
    sStack_ac = (short)((ulong)lVar2 >> 0x20);
    sStack_aa = (short)((ulong)lVar2 >> 0x30);
    *(short *)weight_h[1] = 0x100 - local_b8;
    *(short *)((long)weight_h[1] + 2) = 0x100 - sStack_b6;
    *(short *)((long)weight_h[1] + 4) = 0x100 - sStack_b4;
    *(short *)((long)weight_h[1] + 6) = 0x100 - sStack_b2;
    *(short *)(weight_h[1] + 1) = 0x100 - sStack_b0;
    *(short *)((long)weight_h[1] + 10) = 0x100 - sStack_ae;
    *(short *)((long)weight_h[1] + 0xc) = 0x100 - sStack_ac;
    *(short *)((long)weight_h[1] + 0xe) = 0x100 - sStack_aa;
    *(undefined1 *)weight_h[2] = 0x44;
    *(undefined1 *)((long)weight_h[2] + 1) = 0;
    *(undefined1 *)((long)weight_h[2] + 2) = 0x36;
    *(undefined1 *)((long)weight_h[2] + 3) = 0;
    *(undefined1 *)((long)weight_h[2] + 4) = 0x2b;
    *(undefined1 *)((long)weight_h[2] + 5) = 0;
    *(undefined1 *)((long)weight_h[2] + 6) = 0x21;
    *(undefined1 *)((long)weight_h[2] + 7) = 0;
    *(undefined1 *)(weight_h[2] + 1) = 0x1a;
    *(undefined1 *)((long)weight_h[2] + 9) = 0;
    *(undefined1 *)((long)weight_h[2] + 10) = 0x14;
    *(undefined1 *)((long)weight_h[2] + 0xb) = 0;
    *(undefined1 *)((long)weight_h[2] + 0xc) = 0x11;
    *(undefined1 *)((long)weight_h[2] + 0xd) = 0;
    *(undefined1 *)((long)weight_h[2] + 0xe) = 0x10;
    *(undefined1 *)((long)weight_h[2] + 0xf) = 0;
    lVar1 = weight_h[2][0];
    lVar2 = weight_h[2][1];
    local_d8 = (short)lVar1;
    sStack_d6 = (short)((ulong)lVar1 >> 0x10);
    sStack_d4 = (short)((ulong)lVar1 >> 0x20);
    sStack_d2 = (short)((ulong)lVar1 >> 0x30);
    sStack_d0 = (short)lVar2;
    sStack_ce = (short)((ulong)lVar2 >> 0x10);
    sStack_cc = (short)((ulong)lVar2 >> 0x20);
    sStack_ca = (short)((ulong)lVar2 >> 0x30);
    *(short *)weight_h[3] = 0x100 - local_d8;
    *(short *)((long)weight_h[3] + 2) = 0x100 - sStack_d6;
    *(short *)((long)weight_h[3] + 4) = 0x100 - sStack_d4;
    *(short *)((long)weight_h[3] + 6) = 0x100 - sStack_d2;
    *(short *)(weight_h[3] + 1) = 0x100 - sStack_d0;
    *(short *)((long)weight_h[3] + 10) = 0x100 - sStack_ce;
    *(short *)((long)weight_h[3] + 0xc) = 0x100 - sStack_cc;
    *(short *)((long)weight_h[3] + 0xe) = 0x100 - sStack_ca;
  }
  return;
}

Assistant:

static inline void load_weight_w4(int height, __m128i *weight_h,
                                  __m128i *weight_w) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i d = _mm_set1_epi16((int16_t)(1 << SMOOTH_WEIGHT_LOG2_SCALE));
  const __m128i t = _mm_cvtsi32_si128(((const int *)smooth_weights)[0]);
  weight_h[0] = _mm_unpacklo_epi8(t, zero);
  weight_h[1] = _mm_sub_epi16(d, weight_h[0]);
  weight_w[0] = _mm_unpacklo_epi16(weight_h[0], weight_h[1]);

  if (height == 8) {
    const __m128i weight = _mm_loadl_epi64((const __m128i *)&smooth_weights[4]);
    weight_h[0] = _mm_unpacklo_epi8(weight, zero);
    weight_h[1] = _mm_sub_epi16(d, weight_h[0]);
  } else if (height == 16) {
    const __m128i weight =
        _mm_loadu_si128((const __m128i *)&smooth_weights[12]);
    weight_h[0] = _mm_unpacklo_epi8(weight, zero);
    weight_h[1] = _mm_sub_epi16(d, weight_h[0]);
    weight_h[2] = _mm_unpackhi_epi8(weight, zero);
    weight_h[3] = _mm_sub_epi16(d, weight_h[2]);
  }
}